

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Core.c
# Opt level: O3

Vec_Ptr_t *
Llb_CoreConstructAll(Aig_Man_t *p,Vec_Ptr_t *vResult,Vec_Int_t *vVarsNs,abctime TimeTarget)

{
  uint uVar1;
  Vec_Ptr_t *vLower;
  bool bVar2;
  uint uVar3;
  Vec_Ptr_t *__ptr;
  void **__s;
  DdManager *pDVar4;
  Vec_Ptr_t *vUpper;
  ulong uVar5;
  
  uVar1 = vResult->nSize;
  __ptr = (Vec_Ptr_t *)malloc(0x10);
  uVar3 = 8;
  if (6 < uVar1 - 1) {
    uVar3 = uVar1;
  }
  __ptr->nCap = uVar3;
  if (uVar3 == 0) {
    __s = (void **)0x0;
  }
  else {
    __s = (void **)malloc((long)(int)uVar3 << 3);
  }
  __ptr->pArray = __s;
  __ptr->nSize = uVar1;
  memset(__s,0,(long)(int)uVar1 << 3);
  if (0 < (int)uVar1) {
    vUpper = (Vec_Ptr_t *)0x0;
    uVar5 = (ulong)uVar1;
    do {
      if ((long)vResult->nSize < (long)uVar5) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      vLower = (Vec_Ptr_t *)vResult->pArray[uVar5 - 1];
      if (uVar5 < (uint)vResult->nSize) {
        pDVar4 = Llb_ImgPartition(p,vLower,vUpper,TimeTarget);
      }
      else {
        pDVar4 = Llb_DriverLastPartition(p,vVarsNs,TimeTarget);
      }
      if (pDVar4 == (DdManager *)0x0) {
        uVar5 = 0;
        do {
          pDVar4 = (DdManager *)__s[uVar5];
          if (pDVar4 != (DdManager *)0x0) {
            if (pDVar4->bFunc != (DdNode *)0x0) {
              Cudd_RecursiveDeref(pDVar4,pDVar4->bFunc);
            }
            Extra_StopManager(pDVar4);
          }
          uVar5 = uVar5 + 1;
        } while (uVar1 != uVar5);
        free(__s);
        free(__ptr);
        return (Vec_Ptr_t *)0x0;
      }
      __s[uVar5 - 1] = pDVar4;
      bVar2 = 1 < uVar5;
      vUpper = vLower;
      uVar5 = uVar5 - 1;
    } while (bVar2);
  }
  return __ptr;
}

Assistant:

Vec_Ptr_t * Llb_CoreConstructAll( Aig_Man_t * p, Vec_Ptr_t * vResult, Vec_Int_t * vVarsNs, abctime TimeTarget )
{
    DdManager * dd;
    Vec_Ptr_t * vDdMans;
    Vec_Ptr_t * vLower, * vUpper = NULL;
    int i;
    vDdMans = Vec_PtrStart( Vec_PtrSize(vResult) );
    Vec_PtrForEachEntryReverse( Vec_Ptr_t *, vResult, vLower, i )
    {
        if ( i < Vec_PtrSize(vResult) - 1 )
            dd = Llb_ImgPartition( p, vLower, vUpper, TimeTarget );
        else
            dd = Llb_DriverLastPartition( p, vVarsNs, TimeTarget );
        if ( dd == NULL )
        {
            Vec_PtrForEachEntry( DdManager *, vDdMans, dd, i )
            {
                if ( dd == NULL )
                    continue;
                if ( dd->bFunc )
                    Cudd_RecursiveDeref( dd, dd->bFunc );
                Extra_StopManager( dd );
            }
            Vec_PtrFree( vDdMans );
            return NULL;
        }
        Vec_PtrWriteEntry( vDdMans, i, dd );
        vUpper = vLower;
    }
    return vDdMans;
}